

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::DumbDirectoryDatabase::DumbDirectoryDatabase
          (DumbDirectoryDatabase *this,string *base,DatabaseMode mode_)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_28;
  DatabaseMode mode__local;
  string *base_local;
  DumbDirectoryDatabase *this_local;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__DumbDirectoryDatabase_005bd720;
  std::__cxx11::string::string((string *)&this->base_directory,(string *)base);
  this->mode = mode_;
  local_28 = this->seen_blobs;
  do {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(local_28);
    local_28 = local_28 + 1;
  } while ((DumbDirectoryDatabase *)local_28 != this + 1);
  if (this->mode == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  return;
}

Assistant:

DumbDirectoryDatabase(const string &base, DatabaseMode mode_)
		: DatabaseInterface(mode_), base_directory(base), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
	}